

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O3

int __thiscall
QuantizeData::threshold_distribution
          (QuantizeData *this,vector<float,_std::allocator<float>_> *distribution,int target_bin)

{
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  pointer pfVar1;
  pointer pfVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  size_type sVar6;
  long lVar7;
  int iVar8;
  size_type sVar9;
  QuantizeData *this_00;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar16;
  vector<float,_std::allocator<float>_> t_distribution;
  vector<float,_std::allocator<float>_> quantize_distribution;
  vector<float,_std::allocator<float>_> expand_distribution;
  float local_dc;
  allocator_type local_d5;
  float local_d4;
  int local_d0;
  float local_cc;
  int local_c8;
  float local_c4;
  float local_c0;
  value_type_conflict local_bc;
  vector<float,_std::allocator<float>_> *local_b8;
  size_type local_b0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [32];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar11 = (ulong)((long)(distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  sVar9 = (size_type)target_bin;
  std::vector<float,_std::allocator<float>_>::vector(&local_90,sVar9,(allocator_type *)&local_a8);
  iVar4 = (int)uVar11;
  iVar8 = target_bin;
  if (target_bin < iVar4) {
    fVar12 = 0.0;
    sVar6 = sVar9;
    do {
      fVar12 = fVar12 + (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start[sVar6];
      sVar6 = sVar6 + 1;
    } while ((long)iVar4 != sVar6);
    if (target_bin < iVar4) {
      local_cc = (float)target_bin;
      uVar10 = (ulong)(uint)target_bin;
      local_dc = 1000.0;
      local_d4 = fVar12;
      local_d0 = target_bin;
      local_b8 = distribution;
      local_78._24_8_ = uVar11;
      do {
        __first._M_current =
             (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
        local_c8 = iVar8;
        std::vector<float,std::allocator<float>>::
        vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                  ((vector<float,std::allocator<float>> *)&local_a8,__first,
                   (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                   (__first._M_current + sVar9),(allocator_type *)local_78);
        pfVar2 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar9 - 1] =
             local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[sVar9 - 1] + local_d4;
        pfVar1 = (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_d4 = local_d4 - pfVar1[sVar9];
        if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memset(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,0,
                 ((long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                  (-4 - (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
        }
        fVar12 = (float)(int)sVar9 / local_cc;
        local_b0 = sVar9;
        if (0 < target_bin) {
          uVar11 = 0;
          do {
            fVar13 = (float)(int)uVar11 * fVar12;
            fVar14 = ceilf(fVar13);
            iVar8 = (int)fVar14;
            if (fVar13 < (float)(int)fVar14) {
              pfVar2[uVar11] =
                   ((float)(int)fVar14 - fVar13) * pfVar1[(long)iVar8 + -1] + pfVar2[uVar11];
            }
            fVar13 = fVar13 + fVar12;
            fVar14 = floorf(fVar13);
            iVar4 = (int)fVar14;
            if ((float)(int)fVar14 < fVar13) {
              pfVar2[uVar11] = (fVar13 - (float)(int)fVar14) * pfVar1[iVar4] + pfVar2[uVar11];
            }
            if (iVar8 < iVar4) {
              lVar5 = (long)iVar8;
              fVar13 = pfVar2[uVar11];
              do {
                fVar13 = fVar13 + pfVar1[lVar5];
                pfVar2[uVar11] = fVar13;
                lVar5 = lVar5 + 1;
              } while (iVar4 != lVar5);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar10);
        }
        local_bc = 0.0;
        this_00 = (QuantizeData *)local_78;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)this_00,local_b0,&local_bc,&local_d5);
        uVar3 = local_78._0_8_;
        pfVar1 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < target_bin) {
          pfVar2 = (local_b8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            fVar13 = (float)(int)uVar11 * fVar12;
            fVar14 = ceilf(fVar13);
            iVar8 = (int)fVar14;
            local_48 = (float)(int)fVar14;
            fStack_44 = (float)(int)extraout_XMM0_Db;
            fStack_40 = (float)(int)extraout_XMM0_Dc;
            fStack_3c = (float)(int)extraout_XMM0_Dd;
            local_c4 = 0.0;
            local_58 = 0.0;
            fStack_54 = 0.0;
            fStack_50 = 0.0;
            fStack_4c = 0.0;
            if (fVar13 < local_48) {
              local_c4 = local_48 - fVar13;
              if ((pfVar2[(long)iVar8 + -1] != 0.0) || (NAN(pfVar2[(long)iVar8 + -1]))) {
                local_58 = local_c4;
                fStack_54 = fStack_44;
                fStack_50 = fStack_40;
                fStack_4c = fStack_3c;
              }
            }
            local_c0 = fVar12 + fVar13;
            fVar14 = floorf(local_c0);
            iVar4 = (int)fVar14;
            fVar15 = (float)(int)fVar14;
            lVar5 = (long)iVar4;
            fVar14 = local_58;
            if (local_c0 <= fVar15) {
              fVar16 = 0.0;
            }
            else {
              fVar16 = local_c0 - fVar15;
              if ((pfVar2[lVar5] != 0.0) || (NAN(pfVar2[lVar5]))) {
                fVar14 = local_58 + fVar16;
              }
            }
            if (iVar8 < iVar4) {
              lVar7 = (long)iVar8;
              do {
                fVar14 = (float)(~-(uint)(pfVar2[lVar7] != 0.0) & (uint)fVar14 |
                                (uint)(fVar14 + 1.0) & -(uint)(pfVar2[lVar7] != 0.0));
                lVar7 = lVar7 + 1;
              } while (lVar5 != lVar7);
            }
            fVar14 = pfVar1[uVar11] / fVar14;
            if (fVar13 < local_48) {
              if ((pfVar2[(long)iVar8 + -1] != 0.0) || (NAN(pfVar2[(long)iVar8 + -1]))) {
                lVar7 = (long)iVar8 + -1;
                *(float *)(uVar3 + lVar7 * 4) = local_c4 * fVar14 + *(float *)(uVar3 + lVar7 * 4);
              }
            }
            if ((fVar15 < local_c0) && ((pfVar2[lVar5] != 0.0 || (NAN(pfVar2[lVar5]))))) {
              *(float *)(uVar3 + lVar5 * 4) = fVar16 * fVar14 + *(float *)(uVar3 + lVar5 * 4);
            }
            if (iVar8 < iVar4) {
              lVar7 = (long)iVar8;
              do {
                if ((pfVar2[lVar7] != 0.0) || (NAN(pfVar2[lVar7]))) {
                  *(float *)(local_78._0_8_ + lVar7 * 4) =
                       *(float *)(local_78._0_8_ + lVar7 * 4) + fVar14;
                }
                lVar7 = lVar7 + 1;
              } while (lVar5 != lVar7);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar10);
        }
        fVar12 = compute_kl_divergence
                           (this_00,&local_a8,(vector<float,_std::allocator<float>_> *)local_78);
        sVar9 = local_b0;
        iVar8 = local_c8;
        if (fVar12 < local_dc) {
          iVar8 = (int)local_b0;
        }
        if ((pointer)local_78._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
        }
        uVar3 = local_78._24_8_;
        distribution = local_b8;
        target_bin = local_d0;
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_dc <= fVar12) {
          fVar12 = local_dc;
        }
        sVar9 = sVar9 + 1;
        local_dc = fVar12;
      } while ((int)sVar9 != (int)uVar3);
    }
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar8;
}

Assistant:

int QuantizeData::threshold_distribution(const std::vector<float> &distribution, const int target_bin) 
{
    int target_threshold = target_bin;
    float min_kl_divergence = 1000;
    const int length = distribution.size();

    std::vector<float> quantize_distribution(target_bin);

    float threshold_sum = 0;
    for (int threshold=target_bin; threshold<length; threshold++) 
    {
        threshold_sum += distribution[threshold];
    }

    for (int threshold=target_bin; threshold<length; threshold++) 
    {

        std::vector<float> t_distribution(distribution.begin(), distribution.begin()+threshold);
        
        t_distribution[threshold-1] += threshold_sum; 
        threshold_sum -= distribution[threshold];

        // get P
        fill(quantize_distribution.begin(), quantize_distribution.end(), 0);
        
        const float num_per_bin = static_cast<float>(threshold) / target_bin;

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            const int left_upper = ceil(start);
            if (left_upper > start) 
            {
                const float left_scale = left_upper - start;
                quantize_distribution[i] += left_scale * distribution[left_upper - 1];
            }

            const int right_lower = floor(end);

            if (right_lower < end) 
            {

                const float right_scale = end - right_lower;
                quantize_distribution[i] += right_scale * distribution[right_lower];
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                quantize_distribution[i] += distribution[j];
            }
        }

        // get Q
        std::vector<float> expand_distribution(threshold, 0);

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            float count = 0;

            const int left_upper = ceil(start);
            float left_scale = 0;
            if (left_upper > start) 
            {
                left_scale = left_upper - start;
                if (distribution[left_upper - 1] != 0) 
                {
                    count += left_scale;
                }
            }

            const int right_lower = floor(end);
            float right_scale = 0;
            if (right_lower < end) 
            {
                right_scale = end - right_lower;
                if (distribution[right_lower] != 0) 
                {
                    count += right_scale;
                }
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    count++;
                }
            }

            const float expand_value = quantize_distribution[i] / count;

            if (left_upper > start) 
            {
                if (distribution[left_upper - 1] != 0) 
                {
                    expand_distribution[left_upper - 1] += expand_value * left_scale;
                }
            }
            if (right_lower < end) 
            {
                if (distribution[right_lower] != 0) 
                {
                    expand_distribution[right_lower] += expand_value * right_scale;
                }
            }
            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    expand_distribution[j] += expand_value;
                }
            }
        }

        // kl
        float kl_divergence = compute_kl_divergence(t_distribution, expand_distribution);

        // the best num of bin
        if (kl_divergence < min_kl_divergence) 
        {
            min_kl_divergence = kl_divergence;
            target_threshold = threshold;
        }
    }

    return target_threshold;
}